

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_2;
  MemberSyntax *args_4;
  BindDirectiveSyntax *pBVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_41;
  BindTargetListSyntax *local_40;
  Token local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_40,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    local_40 = (BindTargetListSyntax *)0x0;
  }
  else {
    local_40 = (BindTargetListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x68),(DeepCloneVisitor *)&local_40,
                          (BumpAllocator *)__child_stack);
  }
  args_4 = (MemberSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),&local_41,(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BindDirectiveSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NameSyntax&,slang::syntax::BindTargetListSyntax*,slang::syntax::MemberSyntax&>
                     ((BumpAllocator *)__child_stack,args,&local_38,(NameSyntax *)args_2,&local_40,
                      args_4);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BindDirectiveSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BindDirectiveSyntax>(
        *deepClone(node.attributes, alloc),
        node.bind.deepClone(alloc),
        *deepClone<NameSyntax>(*node.target, alloc),
        node.targetInstances ? deepClone(*node.targetInstances, alloc) : nullptr,
        *deepClone<MemberSyntax>(*node.instantiation, alloc)
    );
}